

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

void reportLpObjSense(HighsLogOptions *log_options,HighsLp *lp)

{
  long in_RSI;
  HighsLogOptions *in_RDI;
  
  if (*(int *)(in_RSI + 0xf0) == 1) {
    highsLogUser(in_RDI,kInfo,"Objective sense is minimize\n");
  }
  else if (*(int *)(in_RSI + 0xf0) == -1) {
    highsLogUser(in_RDI,kInfo,"Objective sense is maximize\n");
  }
  else {
    highsLogUser(in_RDI,kInfo,"Objective sense is ill-defined as %d\n",
                 (ulong)*(uint *)(in_RSI + 0xf0));
  }
  return;
}

Assistant:

void reportLpObjSense(const HighsLogOptions& log_options, const HighsLp& lp) {
  if (lp.sense_ == ObjSense::kMinimize)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is minimize\n");
  else if (lp.sense_ == ObjSense::kMaximize)
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is maximize\n");
  else
    highsLogUser(log_options, HighsLogType::kInfo,
                 "Objective sense is ill-defined as %" HIGHSINT_FORMAT "\n",
                 lp.sense_);
}